

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

int duckdb_shell_sqlite3_bind_parameter_count(sqlite3_stmt *pStmt)

{
  int iVar1;
  pointer pPVar2;
  pointer pPVar3;
  size_type *psVar4;
  
  iVar1 = 0;
  if (pStmt != (sqlite3_stmt *)0x0) {
    if ((pStmt->prepared).
        super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
        .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl ==
        (PreparedStatement *)0x0) {
      if ((pStmt->pending).
          super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
          .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl ==
          (PendingQueryResult *)0x0) {
        return 0;
      }
      pPVar3 = duckdb::
               unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
               ::operator->(&pStmt->pending);
      psVar4 = &(pPVar3->super_BaseQueryResult).properties.parameter_count;
    }
    else {
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->(&pStmt->prepared);
      psVar4 = &(pPVar2->named_param_map)._M_h._M_element_count;
    }
    iVar1 = (int)*psVar4;
  }
  return iVar1;
}

Assistant:

int sqlite3_bind_parameter_count(sqlite3_stmt *pStmt) {
	if (!pStmt) {
		return 0;
	}
	if (pStmt->prepared) {
		return (int)pStmt->prepared->named_param_map.size();
	}
	if (pStmt->pending) {
		return (int)pStmt->pending->properties.parameter_count;
	}
	return 0;
}